

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O0

int __thiscall QtConcurrent::ThreadEngineBarrier::release(ThreadEngineBarrier *this)

{
  bool bVar1;
  int in_EDI;
  long in_FS_OFFSET;
  int localCount;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while (local_10 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x103e2f),
          local_10 != -1) {
      if (local_10 < 0) {
        bVar1 = QBasicAtomicInteger<int>::testAndSetOrdered
                          ((QBasicAtomicInteger<int> *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        if (bVar1) {
          local_c = local_10 + 1;
          local_10 = qAbs<int>(&local_c);
          goto LAB_00103ee2;
        }
      }
      else {
        bVar1 = QBasicAtomicInteger<int>::testAndSetOrdered
                          ((QBasicAtomicInteger<int> *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        if (bVar1) {
          local_10 = local_10 + -1;
LAB_00103ee2:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
            __stack_chk_fail();
          }
          return local_10;
        }
      }
    }
    bVar1 = QBasicAtomicInteger<int>::testAndSetOrdered
                      ((QBasicAtomicInteger<int> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  } while (!bVar1);
  QSemaphore::release(in_EDI + 8);
  local_10 = 0;
  goto LAB_00103ee2;
}

Assistant:

int ThreadEngineBarrier::release()
{
    forever {
        int localCount = count.loadRelaxed();
        if (localCount == -1) {
            if (count.testAndSetOrdered(-1, 0)) {
                semaphore.release();
                return 0;
            }
        } else if (localCount < 0) {
            if (count.testAndSetOrdered(localCount, localCount + 1))
                return qAbs(localCount + 1);
        } else {
            if (count.testAndSetOrdered(localCount, localCount - 1))
                return localCount - 1;
        }
        qYieldCpu();
    }